

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.cpp
# Opt level: O0

wostream * Centaurus::printc(wostream *os,wchar_t ch)

{
  int iVar1;
  wchar_t local_68 [2];
  wchar_t buf [16];
  wchar_t ch_local;
  wostream *os_local;
  
  iVar1 = iswgraph(ch);
  if (iVar1 == 0) {
    swprintf(local_68,0x10,L"\\\\x%0X",(ulong)(uint)ch);
    os_local = std::operator<<(os,local_68);
  }
  else if (ch == L'\"') {
    os_local = std::operator<<(os,L"\\\"");
  }
  else if (ch == L'\\') {
    os_local = std::operator<<(os,L"\\\\");
  }
  else {
    os_local = std::operator<<(os,ch);
  }
  return os_local;
}

Assistant:

static std::wostream& printc(std::wostream& os, wchar_t ch)
{
	if (!iswgraph(ch))
	{
		wchar_t buf[16];
		swprintf(buf, 16, L"\\\\x%0X", (wint_t)ch);
		return os << buf;
	}
	else
	{
		switch (ch)
		{
		case L'"':
			return os << L"\\\"";
		case L'\\':
			return os << L"\\\\";
		default:
			return os << ch;
		}
	}
}